

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

void __thiscall Annotations::Remove(Annotations *this,int id)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  int r;
  char *zErrMsg;
  char sql [1024];
  undefined8 local_420;
  undefined1 local_418 [1048];
  
  local_420 = 0;
  sqlite3_snprintf(0x400,local_418,"UPDATE annotations set visible = 0 where id=%d;",in_ESI);
  iVar1 = sqlite3_exec(*(undefined8 *)(in_RDI + 0x20),local_418,0,0,&local_420);
  if (iVar1 == 0) {
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      fprintf(_stdout,"Records created successfully\n");
    }
  }
  else {
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      fprintf(_stderr,"SQL error: %s\n",local_420);
    }
    sqlite3_free(local_420);
  }
  return;
}

Assistant:

void Annotations::Remove(int id) {
	char sql[1024];
	char *zErrMsg = 0;
	int r;

	sqlite3_snprintf(sizeof(sql), sql, "UPDATE annotations set visible = 0 where id=%d;", id);
	r = sqlite3_exec(sqldb, sql, NULL, 0, &zErrMsg);
	if (r != SQLITE_OK) {
		if (debug) fprintf(stderr, "SQL error: %s\n", zErrMsg);
		sqlite3_free(zErrMsg);
	} else {
		if (debug) fprintf(stdout, "Records created successfully\n");
	}
}